

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

void BenchmarkFunc<TSlowLog,double>
               (vector<double_*,_std::allocator<double_*>_> *inVectors,
               vector<double_*,_std::allocator<double_*>_> *outVectors,size_t vecSize,size_t nIter,
               string *name)

{
  pointer ppdVar1;
  double *pdVar2;
  double dVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer ppdVar6;
  long lVar7;
  ostream *poVar8;
  runtime_error *this;
  double *pdVar9;
  size_t i;
  size_t sVar10;
  ulong uVar11;
  vector<double,_std::allocator<double>_> times;
  vector<double,_std::allocator<double>_> local_88;
  size_t local_68;
  vector<double_*,_std::allocator<double_*>_> *local_60;
  string *local_58;
  size_t local_50;
  long local_48;
  vector<double_*,_std::allocator<double_*>_> *local_40;
  double local_38;
  
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_60 = inVectors;
  local_58 = name;
  local_50 = nIter;
  local_40 = outVectors;
  if (nIter != 0) {
    sVar10 = 0;
    do {
      local_68 = sVar10;
      local_48 = std::chrono::_V2::system_clock::now();
      ppdVar6 = (local_60->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((local_60->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppdVar6) {
        uVar11 = 0;
        do {
          ppdVar1 = (local_40->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar9 = ppdVar1[uVar11];
          if (vecSize != 0) {
            pdVar2 = ppdVar6[uVar11];
            sVar10 = 0;
            do {
              dVar3 = log(pdVar2[sVar10]);
              pdVar9[sVar10] = dVar3;
              sVar10 = sVar10 + 1;
            } while (vecSize != sVar10);
            pdVar9 = ppdVar1[uVar11];
          }
          if (pdVar9 != (double *)0x0) {
            if ((*pdVar9 == 43432432.0) && (!NAN(*pdVar9))) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"requirement outV[0] != 43432432 failed");
              __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          uVar11 = uVar11 + 1;
          ppdVar6 = (local_60->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar11 < (ulong)((long)(local_60->
                                        super__Vector_base<double_*,_std::allocator<double_*>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)ppdVar6 >>
                                 3));
      }
      lVar7 = std::chrono::_V2::system_clock::now();
      local_38 = (double)(lVar7 - local_48) / 1000000000.0;
      if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      pdVar5 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar4 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar10 = local_68 + 1;
    } while (sVar10 != local_50);
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      uVar11 = (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      lVar7 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pdVar4,pdVar5);
    }
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(local_58->_M_dataplus)._M_p,local_58->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
  poVar8 = std::ostream::_M_insert<double>
                     (*local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BenchmarkFunc(const std::vector<T*>& inVectors, std::vector<T*>& outVectors,
                   size_t vecSize, size_t nIter, const std::string& name) {
    std::chrono::high_resolution_clock::time_point t;
    std::vector<double> times;
    for (size_t iterIdx = 0; iterIdx < nIter; ++iterIdx) {
        t = std::chrono::high_resolution_clock::now();
        (void)(iterIdx);
        for (size_t vecIdx = 0; vecIdx < inVectors.size(); ++vecIdx) {
            auto& inV = inVectors[vecIdx];
            auto& outV = outVectors[vecIdx];
            TFunc::Apply(inV, vecSize, outV);
            if (outV && outV[0] == 43432432) {
                throw std::runtime_error("requirement outV[0] != 43432432 failed");
            }
        }
        std::chrono::duration<double> timeSpan = std::chrono::high_resolution_clock::now() - t;
        times.push_back(timeSpan.count());
    }
    std::sort(times.begin(), times.end());
    std::cerr << name << ": " << times[0] << std::endl;
}